

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

void xmlRegisterCharEncodingHandler(xmlCharEncodingHandlerPtr handler)

{
  long lVar1;
  int code;
  char *str1;
  char *msg;
  char *pcVar2;
  
  if (handlers == (xmlCharEncodingHandlerPtr *)0x0) {
    xmlInitCharEncodingHandlers();
  }
  if (handlers == (xmlCharEncodingHandlerPtr *)0x0 || handler == (xmlCharEncodingHandlerPtr)0x0) {
    pcVar2 = (char *)0x0;
    msg = "xmlRegisterCharEncodingHandler: NULL handler !\n";
    str1 = (char *)0x0;
    code = 0x1771;
  }
  else {
    lVar1 = (long)nbCharEncodingHandler;
    if (lVar1 < 0x32) {
      nbCharEncodingHandler = nbCharEncodingHandler + 1;
      handlers[lVar1] = handler;
      return;
    }
    pcVar2 = "MAX_ENCODING_HANDLERS";
    msg = "xmlRegisterCharEncodingHandler: Too many handler registered, see %s\n";
    str1 = "MAX_ENCODING_HANDLERS";
    code = 0x1772;
  }
  __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                  (void *)0x0,0x1b,code,XML_ERR_FATAL,(char *)0x0,0,str1,(char *)0x0,(char *)0x0,0,0
                  ,msg,pcVar2);
  if (handler == (xmlCharEncodingHandlerPtr)0x0) {
    return;
  }
  if (handler->name != (char *)0x0) {
    (*xmlFree)(handler->name);
  }
  (*xmlFree)(handler);
  return;
}

Assistant:

void
xmlRegisterCharEncodingHandler(xmlCharEncodingHandlerPtr handler) {
    if (handlers == NULL) xmlInitCharEncodingHandlers();
    if ((handler == NULL) || (handlers == NULL)) {
        xmlEncodingErr(XML_I18N_NO_HANDLER,
		"xmlRegisterCharEncodingHandler: NULL handler !\n", NULL);
        goto free_handler;
    }

    if (nbCharEncodingHandler >= MAX_ENCODING_HANDLERS) {
        xmlEncodingErr(XML_I18N_EXCESS_HANDLER,
	"xmlRegisterCharEncodingHandler: Too many handler registered, see %s\n",
	               "MAX_ENCODING_HANDLERS");
        goto free_handler;
    }
    handlers[nbCharEncodingHandler++] = handler;
    return;

free_handler:
    if (handler != NULL) {
        if (handler->name != NULL) {
            xmlFree(handler->name);
        }
        xmlFree(handler);
    }
}